

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRMiner.cpp
# Opt level: O1

void dgrminer::getFrequentInitialPatterns
               (set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
                *edges_set,
               vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
               *initial_patterns,
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *initial_patterns_occurrences,int support_as_absolute,bool set_of_graphs,
               PartialUnion *pu)

{
  _Rb_tree_header *__last;
  iterator iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  size_t sVar6;
  _Base_ptr p_Var7;
  bool bVar8;
  set<int,_std::less<int>,_std::allocator<int>_> mapped_occurrences;
  vector<int,_std::allocator<int>_> occs;
  labeled_edge_with_occurrences f;
  _Hashtable<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_148;
  ulong uStack_140;
  undefined8 local_138;
  ulong *local_130;
  ulong *local_128;
  undefined8 local_120;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_118;
  vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>> *local_110;
  void *local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  _Rb_tree_node_base *local_f0;
  undefined1 local_e8 [16];
  _Base_ptr local_d8;
  _Base_ptr p_Stack_d0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_c8;
  _Base_ptr local_98;
  _Base_ptr p_Stack_90;
  _Hashtable<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_88;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_48;
  
  p_Var7 = (edges_set->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_f0 = &(edges_set->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var7 != local_f0) {
    __last = &local_c8._M_impl.super__Rb_tree_header;
    local_118 = initial_patterns_occurrences;
    local_110 = (vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>> *)initial_patterns;
    do {
      local_e8._0_8_ = *(undefined8 *)(p_Var7 + 1);
      local_e8._8_8_ = p_Var7[1]._M_parent;
      local_d8 = p_Var7[1]._M_left;
      p_Stack_d0 = p_Var7[1]._M_right;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
                (&local_c8,
                 (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 (p_Var7 + 2));
      local_98 = p_Var7[3]._M_left;
      p_Stack_90 = p_Var7[3]._M_right;
      local_148 = &local_88;
      local_88._M_buckets = (__buckets_ptr)0x0;
      local_88._M_bucket_count = (size_type)p_Var7[4]._M_parent;
      local_88._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_88._M_element_count = (size_type)p_Var7[4]._M_right;
      local_88._M_rehash_policy._M_max_load_factor = (float)p_Var7[5]._M_color;
      local_88._M_rehash_policy._4_4_ = *(undefined4 *)&p_Var7[5].field_0x4;
      local_88._M_rehash_policy._M_next_resize = (size_t)p_Var7[5]._M_parent;
      local_88._M_single_bucket = (__node_base_ptr)0x0;
      std::
      _Hashtable<int,std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign<std::_Hashtable<int,std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>,false>>>>
                ((_Hashtable<int,std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_148,
                 (_Hashtable<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(p_Var7 + 4),
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_false>_>_>
                  *)&local_148);
      if (set_of_graphs) {
        uStack_140 = uStack_140 & 0xffffffff00000000;
        local_138 = 0;
        local_130 = &uStack_140;
        local_120 = 0;
        local_128 = local_130;
        for (p_Var5 = local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var5 != __last;
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          iVar4 = PartialUnion::queryMappingSnapshotsToGraphs(pu,p_Var5[1]._M_color);
          local_108 = (void *)CONCAT44(local_108._4_4_,iVar4);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          _M_insert_unique<int>
                    ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      *)&local_148,(int *)&local_108);
        }
        bVar2 = PartialUnion::getNewMeasures(pu);
        bVar3 = (int)local_120 < support_as_absolute;
        bVar8 = bVar2 || bVar3;
        if (bVar2 || bVar3) {
          bVar3 = PartialUnion::getNewMeasures(pu);
          if (bVar3) {
            PartialUnion::getEdges(&local_48,pu);
            bVar3 = PartialUnion::getHeuristicMIS(pu);
            sVar6 = labeled_edge_with_occurrences::support
                              ((labeled_edge_with_occurrences *)local_e8,&local_48,true,bVar3);
            if (support_as_absolute <= (int)sVar6) goto LAB_00106c9b;
            bVar8 = true;
          }
          else {
            bVar8 = false;
          }
          bVar3 = false;
        }
        else {
LAB_00106c9b:
          bVar3 = true;
          if (((long)local_e8._0_8_ < 0) && ((int)local_d8 < 0)) {
            bVar3 = -1 < (int)p_Stack_d0;
          }
        }
        if ((bVar8) &&
           (local_48.
            super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0)) {
          operator_delete(local_48.
                          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (bVar3) {
          iVar1._M_current = *(array<int,_8UL> **)(local_110 + 8);
          if (iVar1._M_current == *(array<int,_8UL> **)(local_110 + 0x10)) {
            std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>::
            _M_realloc_insert<std::array<int,8ul>const&>
                      (local_110,iVar1,(array<int,_8UL> *)local_e8);
          }
          else {
            *(_Base_ptr *)((iVar1._M_current)->_M_elems + 4) = local_d8;
            *(_Base_ptr *)((iVar1._M_current)->_M_elems + 6) = p_Stack_d0;
            *(undefined8 *)(iVar1._M_current)->_M_elems = local_e8._0_8_;
            *(undefined8 *)((iVar1._M_current)->_M_elems + 2) = local_e8._8_8_;
            *(long *)(local_110 + 8) = *(long *)(local_110 + 8) + 0x20;
          }
          local_108 = (void *)0x0;
          uStack_100 = 0;
          local_f8 = 0;
          std::__copy_move<false,false,std::bidirectional_iterator_tag>::
          __copy_m<std::_Rb_tree_const_iterator<int>,std::back_insert_iterator<std::vector<int,std::allocator<int>>>>
                    ((_Rb_tree_const_iterator<int>)
                     local_c8._M_impl.super__Rb_tree_header._M_header._M_left,
                     (_Rb_tree_const_iterator<int>)__last,
                     (vector<int,_std::allocator<int>_> *)&local_108);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::push_back(local_118,(vector<int,_std::allocator<int>_> *)&local_108);
          if (local_108 != (void *)0x0) {
            operator_delete(local_108);
          }
        }
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  &local_148);
      }
      else {
        PartialUnion::getEdges
                  ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                   &local_148,pu);
        bVar3 = PartialUnion::getNewMeasures(pu);
        bVar8 = PartialUnion::getHeuristicMIS(pu);
        sVar6 = labeled_edge_with_occurrences::support
                          ((labeled_edge_with_occurrences *)local_e8,
                           (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                           &local_148,bVar3,bVar8);
        if (support_as_absolute <= (int)sVar6) {
          if (((long)local_e8._0_8_ < 0) && ((int)local_d8 < 0)) {
            iVar4 = (int)p_Stack_d0;
            if (local_148 !=
                (_Hashtable<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)0x0) {
              operator_delete(local_148);
            }
            if (iVar4 < 0) goto LAB_00106df2;
          }
          else if (local_148 !=
                   (_Hashtable<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)0x0) {
            operator_delete(local_148);
          }
          iVar1._M_current = *(array<int,_8UL> **)(local_110 + 8);
          if (iVar1._M_current == *(array<int,_8UL> **)(local_110 + 0x10)) {
            std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>::
            _M_realloc_insert<std::array<int,8ul>const&>
                      (local_110,iVar1,(array<int,_8UL> *)local_e8);
          }
          else {
            *(_Base_ptr *)((iVar1._M_current)->_M_elems + 4) = local_d8;
            *(_Base_ptr *)((iVar1._M_current)->_M_elems + 6) = p_Stack_d0;
            *(undefined8 *)(iVar1._M_current)->_M_elems = local_e8._0_8_;
            *(undefined8 *)((iVar1._M_current)->_M_elems + 2) = local_e8._8_8_;
            *(long *)(local_110 + 8) = *(long *)(local_110 + 8) + 0x20;
          }
          local_148 = (_Hashtable<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)0x0;
          uStack_140 = 0;
          local_138 = 0;
          std::__copy_move<false,false,std::bidirectional_iterator_tag>::
          __copy_m<std::_Rb_tree_const_iterator<int>,std::back_insert_iterator<std::vector<int,std::allocator<int>>>>
                    ((_Rb_tree_const_iterator<int>)
                     local_c8._M_impl.super__Rb_tree_header._M_header._M_left,
                     (_Rb_tree_const_iterator<int>)__last,
                     (vector<int,_std::allocator<int>_> *)&local_148);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::push_back(local_118,(vector<int,_std::allocator<int>_> *)&local_148);
        }
        if (local_148 !=
            (_Hashtable<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)0x0) {
          operator_delete(local_148);
        }
      }
LAB_00106df2:
      std::
      _Hashtable<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_88);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_c8);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != local_f0);
  }
  return;
}

Assistant:

void  getFrequentInitialPatterns(std::set<labeled_edge_with_occurrences> &edges_set,
									std::vector<std::array<int, 8>> &initial_patterns,
									std::vector<std::vector<int>> &initial_patterns_occurrences,
									int support_as_absolute, bool set_of_graphs, PartialUnion &pu)
	{
		for (auto f : edges_set)
		{
			if (set_of_graphs) {
				std::set<int> mapped_occurrences;
				std::set<int>::iterator it2;
				for (it2 = f.occurrences.begin(); it2 != f.occurrences.end(); ++it2)
				{
					mapped_occurrences.insert(pu.queryMappingSnapshotsToGraphs(*it2));
				}
				if (((!pu.getNewMeasures() && static_cast<int>(mapped_occurrences.size()) >= support_as_absolute)
					|| (pu.getNewMeasures() && static_cast<int>(f.support(pu.getEdges(), true, pu.getHeuristicMIS())) >= support_as_absolute)) &&
					(f.elements[ADJ_INFO_SRC_CHANGETIME] >= 0 || f.elements[ADJ_INFO_CHANGETIME] >= 0 ||
					 f.elements[ADJ_INFO_DST_CHANGETIME] >= 0))
				{
					initial_patterns.push_back(f.elements);

					std::vector<int> occs;
					std::copy(f.occurrences.begin(), f.occurrences.end(), std::back_inserter(occs));

					initial_patterns_occurrences.push_back(occs);
				}
			}
			else
			{
				if (static_cast<int>(f.support(pu.getEdges(), pu.getNewMeasures(), pu.getHeuristicMIS())) >= support_as_absolute &&
					(f.elements[ADJ_INFO_SRC_CHANGETIME] >= 0 || f.elements[ADJ_INFO_CHANGETIME] >= 0 ||
					 f.elements[ADJ_INFO_DST_CHANGETIME] >= 0))
				{
					// if the edge represents at least one change
					initial_patterns.push_back(f.elements);

					std::vector<int> occs;
					std::copy(f.occurrences.begin(), f.occurrences.end(), std::back_inserter(occs));

					initial_patterns_occurrences.push_back(occs);
				}
			}
		}
	}